

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int duckdb_fmt::v6::internal::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint64_t uVar10;
  char cVar11;
  int iVar12;
  result rVar13;
  byte bVar14;
  byte bVar15;
  undefined8 extraout_RDX;
  long lVar16;
  long lVar17;
  size_t __len;
  ulong uVar18;
  uint64_t uVar19;
  ulong uVar20;
  uint64_t error;
  ulong uVar21;
  boundaries bVar22;
  fp fVar23;
  fp fVar24;
  fp value_00;
  char *pcStack_b0;
  int local_a0;
  int cached_exp10;
  uint64_t local_98;
  buffer<char> *local_90;
  ulong local_88;
  double local_80;
  fp local_78;
  int local_64;
  fixed_handler handler;
  fp local_40;
  
  uVar20 = (ulong)specs & 0xff00000000;
  if (value <= 0.0) {
    if (0 < precision && uVar20 == 0x200000000) {
      buffer<char>::resize(buf,(ulong)(uint)precision);
      switchD_016d8eb1::default(buf->ptr_,0x30,(ulong)(uint)precision);
      return -precision;
    }
    handler.buf = (char *)CONCAT71(handler.buf._1_7_,0x30);
    buffer<char>::push_back(buf,(char *)&handler);
    return 0;
  }
  if ((specs._4_4_ >> 0x1c & 1) == 0) {
    iVar12 = snprintf_float<double>(value,precision,specs,buf);
    return iVar12;
  }
  local_a0 = 0;
  cached_exp10 = 0;
  if (precision == -1) {
    local_78.f = 0;
    local_78.e = 0;
    if ((specs._4_4_ >> 0x1b & 1) == 0) {
      local_90 = buf;
      local_80 = value;
      bVar22 = fp::assign_with_boundaries<double>(&local_78,value);
    }
    else {
      local_90 = buf;
      local_80 = value;
      bVar22 = fp::assign_float_with_boundaries<double>(&local_78,value);
    }
    value_00._8_8_ = bVar22.upper;
    value_00.f = (ulong)(uint)local_78.e;
    fVar23 = normalize<0>((internal *)local_78.f,value_00);
    fVar24 = get_cached_power(-0x7c - fVar23.e,&cached_exp10);
    uVar20 = fVar24.f;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar20;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = fVar23.f;
    local_78.f = SUB168(auVar3 * auVar7,8) - (SUB168(auVar3 * auVar7,0) >> 0x3f);
    cVar11 = (char)fVar23.e + (char)fVar24.e;
    local_78.e = fVar23.e + fVar24.e + 0x40;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar20;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = bVar22.lower;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar20;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = value_00._8_8_;
    lVar17 = SUB168(auVar5 * auVar9,8);
    lVar16 = -(SUB168(auVar5 * auVar9,0) >> 0x3f);
    uVar18 = lVar17 + lVar16 + 1;
    handler.buf = local_90->ptr_;
    handler.size = 0;
    handler._16_8_ = uVar18 - local_78.f;
    bVar14 = -cVar11 - 0x40;
    bVar15 = -cVar11;
    uVar19 = 1L << (bVar15 & 0x3f);
    uVar20 = uVar18 >> (bVar15 & 0x3f);
    error = ((SUB168(auVar4 * auVar8,0) >> 0x3f) - SUB168(auVar4 * auVar8,8)) + lVar17 + lVar16 + 2;
    local_98 = uVar19 - 1;
    uVar18 = uVar18 & local_98;
    local_a0 = count_digits((uint32_t)uVar20);
    do {
      iVar12 = local_a0 + -1;
      switch(iVar12) {
      case 0:
        cVar11 = (char)uVar20;
        uVar20 = 0;
        goto LAB_01afc221;
      case 1:
        pcStack_b0 = (char *)0xa;
        break;
      case 2:
        pcStack_b0 = (char *)0x64;
        break;
      case 3:
        pcStack_b0 = (char *)0x3e8;
        break;
      case 4:
        pcStack_b0 = (char *)0x2710;
        break;
      case 5:
        pcStack_b0 = (char *)0x186a0;
        break;
      case 6:
        pcStack_b0 = (char *)0xf4240;
        break;
      case 7:
        pcStack_b0 = "ESt14default_deleteIS2_ELb1EEE";
        break;
      case 8:
        pcStack_b0 = (char *)0x5f5e100;
        break;
      case 9:
        pcStack_b0 = (char *)0x3b9aca00;
        break;
      default:
        cVar11 = '\0';
        goto LAB_01afc221;
      }
      cVar11 = (char)((uVar20 & 0xffffffff) / (ulong)pcStack_b0);
      uVar20 = (uVar20 & 0xffffffff) % (ulong)pcStack_b0;
LAB_01afc221:
      lVar16 = (long)local_a0;
      local_a0 = iVar12;
      rVar13 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)&handler,cVar11 + '0',
                          *(long *)(&DAT_020431b8 + lVar16 * 8) << (bVar14 & 0x3f),
                          ((uVar20 & 0xffffffff) << (bVar14 & 0x3f)) + uVar18,error,iVar12,true);
      uVar10 = local_98;
      if (rVar13 != more) goto LAB_01afc2bc;
    } while (0 < local_a0);
    do {
      uVar20 = uVar18 * 10;
      error = error * 10;
      uVar18 = uVar20 & uVar10;
      local_a0 = local_a0 + -1;
      rVar13 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)&handler,(char)(uVar20 >> (bVar14 & 0x3f)) + '0'
                          ,uVar19,uVar18,error,local_a0,false);
    } while (rVar13 == more);
LAB_01afc2bc:
    if (rVar13 == error) {
      local_a0 = local_a0 + ~cached_exp10 + handler.size;
      fallback_format<double>(local_80,local_90,&local_a0);
      return local_a0;
    }
    buffer<char>::resize(local_90,(ulong)(uint)handler.size);
    local_64 = cached_exp10;
LAB_01afc349:
    local_a0 = local_a0 - local_64;
  }
  else {
    if (precision < 0x12) {
      local_80 = value;
      fp::assign<double,_0>(&local_40,value);
      fVar23.f = (ulong)(uint)local_40.e;
      fVar23._8_8_ = extraout_RDX;
      fVar23 = normalize<0>((internal *)local_40.f,fVar23);
      local_98 = CONCAT44(local_98._4_4_,fVar23.e);
      fVar24 = get_cached_power(-0x7c - fVar23.e,&cached_exp10);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = fVar24.f;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = fVar23.f;
      handler.buf = buf->ptr_;
      handler.size = 0;
      uVar21 = SUB168(auVar2 * auVar6,8) - (SUB168(auVar2 * auVar6,0) >> 0x3f);
      local_98._0_4_ = fVar24.e + (int)local_98;
      local_64 = cached_exp10;
      handler.fixed = uVar20 == 0x200000000;
      handler.exp10 = -cached_exp10;
      local_88 = CONCAT44(local_88._4_4_,(int)local_98);
      bVar14 = -(char)(int)local_98;
      local_98 = 1L << (bVar14 & 0x3f);
      uVar18 = uVar21 >> (bVar14 & 0x3f);
      local_90 = buf;
      handler.precision = precision;
      local_a0 = count_digits((uint32_t)uVar18);
      rVar13 = fixed_handler::on_start
                         (&handler,*(long *)(&DAT_020431b8 + (long)local_a0 * 8) << (bVar14 & 0x3f),
                          uVar21 / 10,10,&local_a0);
      if (rVar13 == more) {
        bVar14 = -(char)local_88 - 0x40;
        local_88 = local_98 - 1;
        uVar21 = uVar21 & local_88;
        uVar19 = 1;
        do {
          iVar12 = local_a0 + -1;
          switch(iVar12) {
          case 0:
            cVar11 = (char)uVar18;
            uVar18 = 0;
            goto LAB_01afbfff;
          case 1:
            pcStack_b0 = (char *)0xa;
            break;
          case 2:
            pcStack_b0 = (char *)0x64;
            break;
          case 3:
            pcStack_b0 = (char *)0x3e8;
            break;
          case 4:
            pcStack_b0 = (char *)0x2710;
            break;
          case 5:
            pcStack_b0 = (char *)0x186a0;
            break;
          case 6:
            pcStack_b0 = (char *)0xf4240;
            break;
          case 7:
            pcStack_b0 = "ESt14default_deleteIS2_ELb1EEE";
            break;
          case 8:
            pcStack_b0 = (char *)0x5f5e100;
            break;
          case 9:
            pcStack_b0 = (char *)0x3b9aca00;
            break;
          default:
            cVar11 = '\0';
            goto LAB_01afbfff;
          }
          cVar11 = (char)((uVar18 & 0xffffffff) / (ulong)pcStack_b0);
          uVar18 = (uVar18 & 0xffffffff) % (ulong)pcStack_b0;
LAB_01afbfff:
          lVar16 = (long)local_a0;
          local_a0 = iVar12;
          rVar13 = fixed_handler::on_digit
                             (&handler,cVar11 + '0',
                              *(long *)(&DAT_020431b8 + lVar16 * 8) << (bVar14 & 0x3f),
                              ((uVar18 & 0xffffffff) << (bVar14 & 0x3f)) + uVar21,1,iVar12,true);
          if (rVar13 != more) goto LAB_01afc0a4;
        } while (0 < local_a0);
        do {
          uVar18 = uVar21 * 10;
          uVar19 = uVar19 * 10;
          uVar21 = uVar18 & local_88;
          local_a0 = local_a0 + -1;
          rVar13 = fixed_handler::on_digit
                             (&handler,(char)(uVar18 >> (bVar14 & 0x3f)) + '0',local_98,uVar21,
                              uVar19,local_a0,false);
        } while (rVar13 == more);
      }
LAB_01afc0a4:
      buf = local_90;
      value = local_80;
      if (rVar13 != error) {
        uVar18 = (ulong)(uint)handler.size;
        if (0 < handler.size && uVar20 != 0x200000000) {
          uVar18 = (ulong)(uint)handler.size;
          do {
            iVar12 = local_a0 + 1;
            if (local_90->ptr_[uVar18 - 1] != '0') goto LAB_01afc33b;
            bVar1 = 1 < uVar18;
            uVar18 = uVar18 - 1;
            local_a0 = iVar12;
          } while (bVar1);
          uVar18 = 0;
        }
LAB_01afc33b:
        buffer<char>::resize(local_90,uVar18 & 0xffffffff);
        goto LAB_01afc349;
      }
    }
    local_a0 = snprintf_float<double>(value,precision,specs,buf);
  }
  return local_a0;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>(), "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  if (precision != -1) {
    if (precision > 17) return snprintf_float(value, precision, specs, buf);
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::significand_size), cached_exp10);
    normalized = normalized * cached_pow;
    fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error)
      return snprintf_float(value, precision, specs, buf);
    int num_digits = handler.size;
    if (!fixed) {
      // Remove trailing zeros.
      while (num_digits > 0 && buf[num_digits - 1] == '0') {
        --num_digits;
        ++exp;
      }
    }
    buf.resize(to_unsigned(num_digits));
  } else {
    fp fp_value;
    auto boundaries = specs.binary32
                          ? fp_value.assign_float_with_boundaries(value)
                          : fp_value.assign_with_boundaries(value);
    fp_value = normalize(fp_value);
    // Find a cached power of 10 such that multiplying value by it will bring
    // the exponent in the range [min_exp, -32].
    const fp cached_pow = get_cached_power(
        min_exp - (fp_value.e + fp::significand_size), cached_exp10);
    // Multiply value and boundaries by the cached power of 10.
    fp_value = fp_value * cached_pow;
    boundaries.lower = multiply(boundaries.lower, cached_pow.f);
    boundaries.upper = multiply(boundaries.upper, cached_pow.f);
    assert(min_exp <= fp_value.e && fp_value.e <= -32);
    --boundaries.lower;  // \tilde{M}^- - 1 ulp -> M^-_{\downarrow}.
    ++boundaries.upper;  // \tilde{M}^+ + 1 ulp -> M^+_{\uparrow}.
    // Numbers outside of (lower, upper) definitely do not round to value.
    grisu_shortest_handler handler{buf.data(), 0,
                                   boundaries.upper - fp_value.f};
    auto result =
        grisu_gen_digits(fp(boundaries.upper, fp_value.e),
                         boundaries.upper - boundaries.lower, exp, handler);
    if (result == digits::error) {
      exp += handler.size - cached_exp10 - 1;
      fallback_format(value, buf, exp);
      return exp;
    }
    buf.resize(to_unsigned(handler.size));
  }
  return exp - cached_exp10;
}